

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

void __thiscall helics::apps::Source::runTo(Source *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  _Elt_pointer pSVar3;
  long lVar4;
  SourceObject *src;
  Time nextInternalTimeStep;
  _Elt_pointer pSVar5;
  Time currentTime;
  ostream *poVar6;
  _Map_pointer ppSVar7;
  long lVar8;
  _Elt_pointer pSVar9;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = *(char *)((long)&(peVar2->super_ValueFederate).vfManager._M_t.
                           super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                           .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                           _M_head_impl +
                   (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  if (cVar1 == '\x02') {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pSVar5 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar8 = *(long *)(&(peVar2->super_ValueFederate).field_0x28 +
                     (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
    pSVar3 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar5 == pSVar3) {
      nextInternalTimeStep.internalTimeCode = 0x7fffffffffffffff;
    }
    else {
      pSVar9 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppSVar7 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      nextInternalTimeStep.internalTimeCode = 0x7fffffffffffffff;
      do {
        lVar4 = (pSVar5->nextTime).internalTimeCode;
        if (lVar4 < nextInternalTimeStep.internalTimeCode) {
          nextInternalTimeStep.internalTimeCode = lVar4;
        }
        pSVar5 = pSVar5 + 1;
        if (pSVar5 == pSVar9) {
          pSVar5 = ppSVar7[1];
          ppSVar7 = ppSVar7 + 1;
          pSVar9 = pSVar5 + 2;
        }
      } while (pSVar5 != pSVar3);
    }
  }
  else {
    if (cVar1 == '\0') {
      (*(this->super_App)._vptr_App[2])(this);
    }
    runSourceLoop(this,(Time)0xffffffffffffffff);
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar8 = 0;
    Federate::enterExecutingMode
              ((Federate *)
               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
    nextInternalTimeStep = runSourceLoop(this,(Time)0x0);
  }
  if (nextInternalTimeStep.internalTimeCode <= stopTime_input.internalTimeCode &&
      nextInternalTimeStep.internalTimeCode != 0x7fffffffffffffff) {
    lVar8 = lVar8 + 10000000000;
    do {
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      currentTime = Federate::requestTime
                              ((Federate *)
                               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),
                               nextInternalTimeStep);
      nextInternalTimeStep = runSourceLoop(this,currentTime);
      if (lVar8 <= currentTime.internalTimeCode) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"processed time ",0xf);
        poVar6 = std::ostream::_M_insert<double>
                           ((double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
                            (double)(currentTime.internalTimeCode / 1000000000));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        lVar8 = lVar8 + 10000000000;
      }
    } while ((nextInternalTimeStep.internalTimeCode != 0x7fffffffffffffff) &&
            (nextInternalTimeStep.internalTimeCode <= stopTime_input.internalTimeCode));
  }
  return;
}

Assistant:

void Source::runTo(Time stopTime_input)
    {
        auto md = fed->getCurrentMode();
        if (md == Federate::Modes::STARTUP) {
            initialize();
        }
        Time nextRequestTime = Time::maxVal();
        Time currentTime;
        if (md != Federate::Modes::EXECUTING) {
            // send stuff before timeZero

            runSourceLoop(timeZero - timeEpsilon);

            fed->enterExecutingMode();
            // send the stuff at timeZero
            nextRequestTime = runSourceLoop(timeZero);
            currentTime = timeZero;
        } else {
            currentTime = fed->getCurrentTime();

            for (auto& src : sources) {
                if (src.nextTime < nextRequestTime) {
                    nextRequestTime = src.nextTime;
                }
            }
        }
        helics::Time nextPrintTime = currentTime + 10.0;
        while ((nextRequestTime < Time::maxVal()) && (nextRequestTime <= stopTime_input)) {
            currentTime = fed->requestTime(nextRequestTime);
            nextRequestTime = runSourceLoop(currentTime);
            if (currentTime >= nextPrintTime) {
                std::cout << "processed time " << static_cast<double>(currentTime) << "\n";
                nextPrintTime += 10.0;
            }
        }
    }